

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O0

void __thiscall PrintLanguage::pushAtom(PrintLanguage *this,Atom *atom)

{
  int iVar1;
  EmitXml *pEVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  Atom *atom_local;
  PrintLanguage *this_local;
  
  iVar1 = this->pending;
  sVar4 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::size
                    (&this->nodepend);
  if ((ulong)(long)iVar1 < sVar4) {
    recurse(this);
  }
  bVar3 = std::vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
          empty(&this->revpol);
  if (bVar3) {
    emitAtom(this,atom);
  }
  else {
    pvVar5 = std::
             vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
             back(&this->revpol);
    emitOp(this,pvVar5);
    emitAtom(this,atom);
    do {
      pvVar5 = std::
               vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
               back(&this->revpol);
      pvVar5->visited = pvVar5->visited + 1;
      pvVar5 = std::
               vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
               back(&this->revpol);
      iVar1 = pvVar5->visited;
      pvVar5 = std::
               vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
               back(&this->revpol);
      if (iVar1 != pvVar5->tok->stage) {
        return;
      }
      pvVar5 = std::
               vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
               back(&this->revpol);
      emitOp(this,pvVar5);
      pvVar5 = std::
               vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
               back(&this->revpol);
      if ((pvVar5->paren & 1U) == 0) {
        pEVar2 = this->emit;
        pvVar5 = std::
                 vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
                 ::back(&this->revpol);
        (*pEVar2->_vptr_EmitXml[0x1d])(pEVar2,(ulong)(uint)pvVar5->id);
      }
      else {
        pEVar2 = this->emit;
        pvVar5 = std::
                 vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
                 ::back(&this->revpol);
        (*pEVar2->_vptr_EmitXml[0x1b])(pEVar2,0x29,(ulong)(uint)pvVar5->id);
      }
      std::vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
      pop_back(&this->revpol);
      bVar3 = std::
              vector<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>::
              empty(&this->revpol);
    } while (((bVar3 ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void PrintLanguage::pushAtom(const Atom &atom)

{
  if (pending < nodepend.size()) // pending varnodes before atom
    recurse();			// So we must recurse

  if (revpol.empty())
    emitAtom(atom);
  else {
    emitOp(revpol.back());
    emitAtom(atom);
    do {
      revpol.back().visited += 1;
      if (revpol.back().visited == revpol.back().tok->stage) {
	emitOp(revpol.back());
	if (revpol.back().paren)
	  emit->closeParen(')',revpol.back().id);
	else
	  emit->closeGroup(revpol.back().id);
	revpol.pop_back();
      }
      else
	break;
    } while(!revpol.empty());
  }
}